

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O2

base_learner * active_cover_setup(options_i *options,vw *all)

{
  int iVar1;
  size_t i;
  option_group_definition *poVar2;
  typed_option<float> *ptVar3;
  typed_option<unsigned_long> *op;
  base_learner *l;
  single_learner *base;
  float *pfVar4;
  learner<active_cover,_example> *plVar5;
  vw_exception *pvVar6;
  _Head_base<0UL,_active_cover_*,_false> _Var7;
  ulong uVar8;
  ulong uVar9;
  bool active_cover_option;
  allocator local_704;
  allocator local_703;
  allocator local_702;
  allocator local_701;
  allocator local_700;
  allocator local_6ff;
  allocator local_6fe;
  allocator local_6fd;
  allocator local_6fc;
  allocator local_6fb;
  allocator local_6fa;
  allocator local_6f9;
  free_ptr<active_cover> data;
  string local_6e8 [32];
  string local_6c8;
  string local_6a8 [32];
  string local_688;
  string local_668 [32];
  string local_648;
  string local_628 [32];
  string local_608;
  string local_5e8 [32];
  string local_5c8;
  string local_5a8 [32];
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  option_group_definition new_options;
  stringstream __msg;
  undefined1 local_4c0 [96];
  bool local_460;
  typed_option<float> local_348;
  undefined1 local_2a8 [160];
  typed_option<unsigned_long> local_208;
  typed_option<float> local_168;
  typed_option<float> local_c8;
  
  scoped_calloc_or_throw<active_cover>();
  std::__cxx11::string::string
            ((string *)&local_568,"Active Learning with Cover",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  active_cover_option = false;
  std::__cxx11::string::string((string *)&local_588,"active_cover",&local_6f9);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_588,&active_cover_option);
  local_460 = true;
  std::__cxx11::string::string(local_5a8,"enable active learning with cover",&local_6fa);
  std::__cxx11::string::_M_assign((string *)(local_4c0 + 0x20));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::string((string *)&local_5c8,"mellowness",&local_6fb);
  VW::config::typed_option<float>::typed_option
            (&local_348,&local_5c8,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->active_c0);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_348,8.0);
  std::__cxx11::string::string
            (local_5e8,"active learning mellowness parameter c_0. Default 8.",&local_6fc);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_608,"alpha",&local_6fd);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_608,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->alpha);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string
            (local_628,"active learning variance upper bound parameter alpha. Default 1.",&local_6fe
            );
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_648,"beta_scale",&local_6ff);
  VW::config::typed_option<float>::typed_option
            (&local_168,&local_648,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_168,3.1622777);
  std::__cxx11::string::string
            (local_668,
             "active learning variance upper bound parameter beta_scale. Default sqrt(10).",
             &local_700);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_688,"cover",&local_701);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_208,&local_688,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size);
  local_208.super_base_option.m_keep = true;
  op = VW::config::typed_option<unsigned_long>::default_value(&local_208,0xc);
  std::__cxx11::string::string(local_6a8,"cover size. Default 12.",&local_702);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar2,op);
  std::__cxx11::string::string((string *)&local_6c8,"oracular",&local_703);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a8,&local_6c8,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->oracular);
  std::__cxx11::string::string
            (local_6e8,"Use Oracular-CAL style query or not. Default false.",&local_704);
  std::__cxx11::string::_M_assign((string *)(local_2a8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar2,(typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string(local_6e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string(local_6a8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string(local_668);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string(local_628);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string(local_5e8);
  VW::config::typed_option<float>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string(local_5a8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_588);
  (**options->_vptr_options_i)(options,&new_options);
  if (active_cover_option == false) {
    plVar5 = (learner<active_cover,_example> *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale =
         (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale *
         (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale;
    if ((data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->oracular == true) {
      (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size = 0;
    }
    std::__cxx11::string::string((string *)&__msg,"lda",(allocator *)&local_348);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_4c0,"error: you can\'t combine lda and active learning");
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x101,&local_528);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"active",(allocator *)&local_348);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_4c0,
                      "error: you can\'t use --active_cover and --active at the same time");
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x104,&local_548);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    _Var7 = data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_active_cover_*,_false>;
    uVar8 = (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size;
    uVar9 = -(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4;
    pfVar4 = (float *)operator_new__(uVar9);
    (_Var7._M_head_impl)->lambda_n = pfVar4;
    pfVar4 = (float *)operator_new__(uVar9);
    (_Var7._M_head_impl)->lambda_d = pfVar4;
    for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
      (_Var7._M_head_impl)->lambda_n[uVar9] = 0.0;
      (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->lambda_d[uVar9] = 0.125;
      uVar8 = (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size;
      _Var7 = data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_active_cover_*,_false>;
    }
    plVar5 = LEARNER::init_learner<active_cover,example,LEARNER::learner<char,example>>
                       (&data,base,predict_or_learn_active_cover<true>,
                        predict_or_learn_active_cover<false>,uVar8 + 1);
    *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* active_cover_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active_cover>();
  option_group_definition new_options("Active Learning with Cover");

  bool active_cover_option = false;
  new_options.add(make_option("active_cover", active_cover_option).keep().help("enable active learning with cover"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8."))
      .add(make_option("alpha", data->alpha)
               .default_value(1.f)
               .help("active learning variance upper bound parameter alpha. Default 1."))
      .add(make_option("beta_scale", data->beta_scale)
               .default_value(sqrtf(10.f))
               .help("active learning variance upper bound parameter beta_scale. Default sqrt(10)."))
      .add(make_option("cover", data->cover_size).keep().default_value(12).help("cover size. Default 12."))
      .add(make_option("oracular", data->oracular).help("Use Oracular-CAL style query or not. Default false."));
  options.add_and_parse(new_options);

  if (!active_cover_option)
    return nullptr;

  data->all = &all;
  data->beta_scale *= data->beta_scale;

  if (data->oracular)
    data->cover_size = 0;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --active_cover and --active at the same time");

  auto base = as_singleline(setup_base(options, all));

  data->lambda_n = new float[data->cover_size];
  data->lambda_d = new float[data->cover_size];

  for (size_t i = 0; i < data->cover_size; i++)
  {
    data->lambda_n[i] = 0.f;
    data->lambda_d[i] = 1.f / 8.f;
  }

  // Create new learner
  learner<active_cover, example>& l = init_learner(
      data, base, predict_or_learn_active_cover<true>, predict_or_learn_active_cover<false>, data->cover_size + 1);
  l.set_finish(finish);

  return make_base(l);
}